

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::ReadTrueTypeCollection
               (Buffer *file,uint8_t *data,size_t len,FontCollection *font_collection)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  iterator iVar4;
  bool bVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  pointer font;
  ulong uVar6;
  uint *puVar7;
  bool bVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  all_tables;
  uint *local_88;
  iterator iStack_80;
  uint *local_78;
  size_t local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table_*>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  local_60;
  
  uVar2 = file->length_;
  sVar3 = file->offset_;
  uVar6 = sVar3 + 4;
  if (uVar6 <= uVar2) {
    uVar1 = *(uint *)(file->buffer_ + sVar3);
    font_collection->header_version =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    file->offset_ = uVar6;
    if (sVar3 + 8 <= uVar2) {
      uVar1 = *(uint *)(file->buffer_ + uVar6);
      uVar6 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                     uVar1 << 0x18);
      file->offset_ = sVar3 + 8;
      local_88 = (uint *)0x0;
      iStack_80._M_current = (uint *)0x0;
      local_78 = (uint *)0x0;
      local_68 = len;
      if (uVar6 != 0) {
        do {
          uVar2 = file->offset_ + 4;
          if (file->length_ < uVar2) {
            bVar8 = false;
            goto LAB_00106222;
          }
          uVar1 = *(uint *)(file->buffer_ + file->offset_);
          local_60._M_impl._0_4_ =
               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          file->offset_ = uVar2;
          if (iStack_80._M_current == local_78) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,iStack_80,
                       (uint *)&local_60);
          }
          else {
            *iStack_80._M_current = local_60._M_impl._0_4_;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      std::vector<woff2::Font,_std::allocator<woff2::Font>_>::resize
                (&font_collection->fonts,(long)iStack_80._M_current - (long)local_88 >> 2);
      iVar4._M_current = iStack_80._M_current;
      font = (font_collection->fonts).super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
             _M_impl.super__Vector_impl_data._M_start;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar7 = local_88; bVar8 = puVar7 == iVar4._M_current, !bVar8; puVar7 = puVar7 + 1) {
        file->offset_ = (ulong)*puVar7;
        bVar5 = ReadCollectionFont(file,data,local_68,font,
                                   (map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                                    *)&local_60);
        if (!bVar5) break;
        font = font + 1;
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table_*>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
      ::~_Rb_tree(&local_60);
LAB_00106222:
      if (local_88 == (uint *)0x0) {
        return bVar8;
      }
      operator_delete(local_88);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool ReadTrueTypeCollection(Buffer* file, const uint8_t* data, size_t len,
                            FontCollection* font_collection) {
    uint32_t num_fonts;

    if (!file->ReadU32(&font_collection->header_version) ||
        !file->ReadU32(&num_fonts)) {
      return FONT_COMPRESSION_FAILURE();
    }

    std::vector<uint32_t> offsets;
    for (size_t i = 0; i < num_fonts; i++) {
      uint32_t offset;
      if (!file->ReadU32(&offset)) {
        return FONT_COMPRESSION_FAILURE();
      }
      offsets.push_back(offset);
    }

    font_collection->fonts.resize(offsets.size());
    std::vector<Font>::iterator font_it = font_collection->fonts.begin();

    std::map<uint32_t, Font::Table*> all_tables;
    for (const auto offset : offsets) {
      file->set_offset(offset);
      Font& font = *font_it++;
      if (!ReadCollectionFont(file, data, len, &font, &all_tables)) {
        return FONT_COMPRESSION_FAILURE();
      }
    }

    return true;
}